

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O2

void sum_histograms(uint32_t kHistBuckets,uint32_t kHistSize,uint32_t *hist)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint32_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t *puVar9;
  uint32_t bucket;
  ulong uVar10;
  ulong uStack_20;
  uint32_t auStack_18 [2];
  
  uVar3 = (ulong)kHistBuckets;
  lVar4 = -(uVar3 * 4 + 0xf & 0xfffffffffffffff0);
  lVar5 = lVar4 + -0x18;
  uVar7 = (ulong)kHistSize;
  puVar6 = hist;
  for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
    uVar1 = *puVar6;
    *puVar6 = 0;
    *(uint32_t *)((long)auStack_18 + uVar8 * 4 + lVar5 + 0x18) = uVar1;
    puVar6 = puVar6 + uVar7;
  }
  puVar6 = hist + 1;
  *(undefined8 *)((long)&uStack_20 + lVar4) = 1;
  for (uVar8 = *(ulong *)((long)&uStack_20 + lVar4); uVar8 < uVar7; uVar8 = uVar8 + 1) {
    puVar9 = puVar6;
    for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
      uVar1 = *(uint32_t *)((long)auStack_18 + uVar10 * 4 + lVar5 + 0x18);
      uVar2 = *puVar9;
      *puVar9 = uVar1;
      *(uint32_t *)((long)auStack_18 + uVar10 * 4 + lVar5 + 0x18) = uVar2 + uVar1;
      puVar9 = puVar9 + uVar7;
    }
    puVar6 = puVar6 + 1;
  }
  return;
}

Assistant:

static void sum_histograms(uint32_t kHistBuckets, uint32_t kHistSize, uint32_t* restrict hist)
{
    uint32_t sum[kHistBuckets];
    for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
    {
        uint32_t* restrict offset = hist + (bucket * kHistSize);
        sum[bucket] = offset[0];
        offset[0] = 0;
    }

    uint32_t tsum;
    for (uint32_t i = 1; i < kHistSize; ++i)
    {
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            uint32_t* restrict offset = hist + (bucket * kHistSize);
            tsum = offset[i] + sum[bucket];
            offset[i] = sum[bucket];
            sum[bucket] = tsum;
        }
    }
}